

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_serialize_set_element
          (t_lua_generator *this,ostream *out,t_set *tset,string *iter)

{
  t_type *type;
  allocator local_129;
  string local_128;
  string local_f8;
  undefined1 local_d8 [8];
  t_field efield;
  string *iter_local;
  t_set *tset_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  efield._168_8_ = iter;
  type = t_set::get_elem_type(tset);
  std::__cxx11::string::string((string *)&local_f8,(string *)iter);
  t_field::t_field((t_field *)local_d8,type,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"",&local_129);
  generate_serialize_field(this,out,(t_field *)local_d8,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  t_field::~t_field((t_field *)local_d8);
  return;
}

Assistant:

void t_lua_generator::generate_serialize_set_element(ostream& out, t_set* tset, string iter) {
  t_field efield(tset->get_elem_type(), iter);
  generate_serialize_field(out, &efield, "");
}